

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion-sort.c
# Opt level: O3

void insertion_sort(int *array,size_t length)

{
  int iVar1;
  void *__dest;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  __dest = malloc(length * 4);
  if ((length != 0) && (memcpy(__dest,array,length * 4), length != 1)) {
    uVar2 = 1;
    sVar4 = 1;
    do {
      iVar1 = *(int *)((long)__dest + sVar4 * 4);
      if (uVar2 != 0) {
        uVar5 = 0;
LAB_00101233:
        if (array[uVar5] < iVar1) goto code_r0x00101239;
        for (uVar3 = uVar2 + 1; uVar5 < uVar3; uVar3 = uVar3 - 1) {
          array[uVar3] = array[uVar3 - 1];
        }
        array[uVar5] = iVar1;
        goto LAB_0010126a;
      }
LAB_00101241:
      array[uVar2] = iVar1;
LAB_0010126a:
      uVar2 = uVar2 + 1;
      sVar4 = sVar4 + 1;
    } while (sVar4 != length);
  }
  free(__dest);
  return;
code_r0x00101239:
  uVar5 = uVar5 + 1;
  if (uVar2 == uVar5) goto LAB_00101241;
  goto LAB_00101233;
}

Assistant:

void insertion_sort(int* array, const size_t length) {
  int* buffer = (int*)malloc(length * sizeof(int));
  size_t target_len = 1; // populated by the first element, already present
  for (size_t n = 0; n < length; n++) {
    buffer[n] = array[n];
  }
  for (size_t buffer_pos = 1; buffer_pos < length; buffer_pos++) {
    int current = buffer[buffer_pos];
    bool inserted = false;
    for (size_t n = 0; n < target_len; n++) {
      if (array[n] >= current) {
        // shift and insert
        for (size_t o = target_len + 1; o > n; o--) {
          array[o] = array[o - 1];
        }
        array[n] = current;
        target_len++;
        inserted = true;
        break;
      }
    }
    if (!inserted) {
      // push at the end
      array[target_len] = current;
      target_len++;
    }
  }
  free(buffer);
}